

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

void __thiscall pbrt::OctahedralVector::OctahedralVector(OctahedralVector *this,Vector3f v)

{
  uint16_t uVar1;
  int iVar2;
  uint16_t *in_RDI;
  uint16_t *puVar3;
  Tuple3<pbrt::Vector3,float> *this_00;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 in_ZMM0 [64];
  float in_XMM1_Da;
  undefined8 local_c;
  float local_4;
  
  local_c = vmovlpd_avx(in_ZMM0._0_16_);
  puVar3 = in_RDI;
  fVar4 = (float)local_c;
  local_4 = in_XMM1_Da;
  std::abs((int)in_RDI);
  iVar2 = (int)puVar3;
  fVar5 = local_c._4_4_;
  std::abs(iVar2);
  fVar6 = local_4;
  std::abs(iVar2);
  this_00 = (Tuple3<pbrt::Vector3,float> *)&local_c;
  Tuple3<pbrt::Vector3,float>::operator/=(this_00,fVar4 + fVar5 + fVar6);
  iVar2 = (int)this_00;
  if (local_4 < 0.0) {
    std::abs(iVar2);
    Sign(0.0);
    uVar1 = Encode(0.0);
    *in_RDI = uVar1;
    std::abs(iVar2);
    Sign(0.0);
    uVar1 = Encode(0.0);
    in_RDI[1] = uVar1;
  }
  else {
    uVar1 = Encode(0.0);
    *in_RDI = uVar1;
    uVar1 = Encode(0.0);
    in_RDI[1] = uVar1;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    OctahedralVector(Vector3f v) {
        v /= std::abs(v.x) + std::abs(v.y) + std::abs(v.z);
        if (v.z >= 0) {
            x = Encode(v.x);
            y = Encode(v.y);
        } else {
            // Encode octahedral vector with $z < 0$
            x = Encode((1 - std::abs(v.y)) * Sign(v.x));
            y = Encode((1 - std::abs(v.x)) * Sign(v.y));
        }
    }